

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::
commonPrefixSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
          (DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
           *this,key_type_conflict *key,result_pair_type *result,size_t result_len,size_t len,
          size_t node_pos)

{
  int iVar1;
  uint uVar2;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *in_RDI;
  ulong in_R8;
  long in_R9;
  size_t i;
  uint p;
  int n;
  size_t num;
  int b;
  char *in_stack_ffffffffffffff98;
  ulong local_58;
  ulong local_48;
  uint local_40;
  ulong local_30;
  
  local_30 = in_R8;
  if (in_R8 == 0) {
    local_30 = Length<char>::operator()((Length<char> *)in_RDI,in_stack_ffffffffffffff98);
  }
  local_40 = in_RDI->array_[in_R9].base;
  local_48 = 0;
  local_58 = 0;
  while( true ) {
    if (local_30 <= local_58) {
      iVar1 = in_RDI->array_[local_40].base;
      if ((local_40 == in_RDI->array_[local_40].check) && (iVar1 < 0)) {
        if (local_48 < in_RCX) {
          DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
          set_result(in_RDI,(result_pair_type *)(in_RDX + local_48 * 0x10),-1 - iVar1,local_30);
        }
        local_48 = local_48 + 1;
      }
      return local_48;
    }
    iVar1 = in_RDI->array_[local_40].base;
    if ((local_40 == in_RDI->array_[local_40].check) && (iVar1 < 0)) {
      if (local_48 < in_RCX) {
        DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
        set_result(in_RDI,(result_pair_type *)(in_RDX + local_48 * 0x10),-1 - iVar1,local_58);
      }
      local_48 = local_48 + 1;
    }
    uVar2 = local_40 + *(byte *)(in_RSI + local_58) + 1;
    if (local_40 != in_RDI->array_[uVar2].check) break;
    local_40 = in_RDI->array_[uVar2].base;
    local_58 = local_58 + 1;
  }
  return local_48;
}

Assistant:

size_t commonPrefixSearch(const key_type *key,
                            T* result,
                            size_t result_len,
                            size_t len = 0,
                            size_t node_pos = 0) const {
    if (!len) len = length_func_()(key);

    register array_type_  b   = array_[node_pos].base;
    register size_t     num = 0;
    register array_type_  n;
    register array_u_type_ p;

    for (register size_t i = 0; i < len; ++i) {
      p = b;  // + 0;
      n = array_[p].base;
      if ((array_u_type_) b == array_[p].check && n < 0) {
        // result[num] = -n-1;
        if (num < result_len) set_result(result[num], -n-1, i);
        ++num;
      }

      p = b +(node_u_type_)(key[i]) + 1;
      if ((array_u_type_) b == array_[p].check)
        b = array_[p].base;
      else
        return num;
    }

    p = b;
    n = array_[p].base;

    if ((array_u_type_)b == array_[p].check && n < 0) {
      if (num < result_len) set_result(result[num], -n-1, len);
      ++num;
    }

    return num;
  }